

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O3

ostream * sciplot::internal::
          writeline<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
                    (ostream *out,size_t i,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *v,vector<double,_std::allocator<double>_> *args)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  escapeIfNeeded<std::__cxx11::string>
            (&local_40,
             (internal *)
             ((v->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + i),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                           local_40._M_dataplus._M_p._0_1_),
                      local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
      &local_40.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_),
                    local_40.field_2._M_allocated_capacity + 1);
  }
  poVar1 = std::ostream::_M_insert<double>
                     ((args->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[i]);
  local_40._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
  return out;
}

Assistant:

auto writeline(std::ostream& out, std::size_t i, const VectorType& v, const Args&... args) -> std::ostream&
{
    out << escapeIfNeeded(v[i]) << " ";
    writeline(out, i, args...);
    return out;
}